

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# architecture.cc
# Opt level: O1

void __thiscall Architecture::~Architecture(Architecture *this)

{
  Database *this_00;
  OptionDatabase *this_01;
  pointer pPVar1;
  pointer pcVar2;
  pointer ppRVar3;
  pointer ppPVar4;
  _Rb_tree_node_base *p_Var5;
  pointer ppTVar6;
  ulong uVar7;
  long lVar8;
  
  (this->super_AddrSpaceManager)._vptr_AddrSpaceManager = (_func_int **)&PTR__Architecture_003bdca8;
  ppTVar6 = (this->inst).super__Vector_base<TypeOp_*,_std::allocator<TypeOp_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppTVar6 !=
      (this->inst).super__Vector_base<TypeOp_*,_std::allocator<TypeOp_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      if (*ppTVar6 != (TypeOp *)0x0) {
        (*(*ppTVar6)->_vptr_TypeOp[4])();
      }
      ppTVar6 = ppTVar6 + 1;
    } while (ppTVar6 !=
             (this->inst).super__Vector_base<TypeOp_*,_std::allocator<TypeOp_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  ppRVar3 = (this->extra_pool_rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->extra_pool_rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppRVar3) {
    uVar7 = 0;
    do {
      if (ppRVar3[uVar7] != (Rule *)0x0) {
        (*ppRVar3[uVar7]->_vptr_Rule[1])();
      }
      uVar7 = uVar7 + 1;
      ppRVar3 = (this->extra_pool_rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl
                .super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(this->extra_pool_rules).
                                   super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)ppRVar3 >> 3));
  }
  this_00 = this->symboltab;
  if (this_00 != (Database *)0x0) {
    Database::~Database(this_00);
    operator_delete(this_00);
  }
  ppPVar4 = (this->printlist).super__Vector_base<PrintLanguage_*,_std::allocator<PrintLanguage_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->printlist).
                              super__Vector_base<PrintLanguage_*,_std::allocator<PrintLanguage_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppPVar4) >> 3)) {
    lVar8 = 0;
    do {
      if (ppPVar4[lVar8] != (PrintLanguage *)0x0) {
        (*ppPVar4[lVar8]->_vptr_PrintLanguage[0x11])();
      }
      lVar8 = lVar8 + 1;
      ppPVar4 = (this->printlist).
                super__Vector_base<PrintLanguage_*,_std::allocator<PrintLanguage_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (lVar8 < (int)((ulong)((long)(this->printlist).
                                         super__Vector_base<PrintLanguage_*,_std::allocator<PrintLanguage_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar4)
                          >> 3));
  }
  this_01 = this->options;
  if (this_01 != (OptionDatabase *)0x0) {
    OptionDatabase::~OptionDatabase(this_01);
    operator_delete(this_01);
  }
  for (p_Var5 = (this->protoModels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(this->protoModels)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    if (*(long **)(p_Var5 + 2) != (long *)0x0) {
      (**(code **)(**(long **)(p_Var5 + 2) + 8))();
    }
  }
  if (this->types != (TypeFactory *)0x0) {
    (*this->types->_vptr_TypeFactory[2])();
  }
  if (this->translate != (Translate *)0x0) {
    (*(this->translate->super_AddrSpaceManager)._vptr_AddrSpaceManager[1])();
  }
  if (this->loader != (LoadImage *)0x0) {
    (*this->loader->_vptr_LoadImage[1])();
  }
  if (this->pcodeinjectlib != (PcodeInjectLibrary *)0x0) {
    (*this->pcodeinjectlib->_vptr_PcodeInjectLibrary[3])();
  }
  if (this->commentdb != (CommentDatabase *)0x0) {
    (*this->commentdb->_vptr_CommentDatabase[1])();
  }
  if (this->cpool != (ConstantPool *)0x0) {
    (*this->cpool->_vptr_ConstantPool[2])();
  }
  if (this->context != (ContextDatabase *)0x0) {
    (*this->context->_vptr_ContextDatabase[7])();
  }
  ActionDatabase::~ActionDatabase(&this->allacts);
  pPVar1 = (this->splitrecords).
           super__Vector_base<PreferSplitRecord,_std::allocator<PreferSplitRecord>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pPVar1 != (pointer)0x0) {
    operator_delete(pPVar1);
  }
  UserOpManage::~UserOpManage(&this->userops);
  ppTVar6 = (this->inst).super__Vector_base<TypeOp_*,_std::allocator<TypeOp_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppTVar6 != (pointer)0x0) {
    operator_delete(ppTVar6);
  }
  ppPVar4 = (this->printlist).super__Vector_base<PrintLanguage_*,_std::allocator<PrintLanguage_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppPVar4 != (pointer)0x0) {
    operator_delete(ppPVar4);
  }
  std::_Rb_tree<Range,_Range,_std::_Identity<Range>,_std::less<Range>,_std::allocator<Range>_>::
  ~_Rb_tree((_Rb_tree<Range,_Range,_std::_Identity<Range>,_std::less<Range>,_std::allocator<Range>_>
             *)&this->nohighptr);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ProtoModel_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ProtoModel_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ProtoModel_*>_>_>
  ::~_Rb_tree(&(this->protoModels)._M_t);
  ppRVar3 = (this->extra_pool_rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppRVar3 != (pointer)0x0) {
    operator_delete(ppRVar3);
  }
  pcVar2 = (this->archid)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->archid).field_2) {
    operator_delete(pcVar2);
  }
  AddrSpaceManager::~AddrSpaceManager(&this->super_AddrSpaceManager);
  return;
}

Assistant:

Architecture::~Architecture(void)

{				// Delete anything that was allocated
  vector<TypeOp *>::iterator iter;
  TypeOp *t_op;

  for(iter=inst.begin();iter!=inst.end();++iter) {
    t_op = *iter;
    if (t_op != (TypeOp *)0)
      delete t_op;
  }
  for(int4 i=0;i<extra_pool_rules.size();++i)
    delete extra_pool_rules[i];

  delete symboltab;
  for(int4 i=0;i<(int4)printlist.size();++i)
    delete printlist[i];
  delete options;
#ifdef CPUI_STATISTICS
  delete stats;
#endif

  map<string,ProtoModel *>::const_iterator piter;
  for(piter=protoModels.begin();piter!=protoModels.end();++piter)
    delete (*piter).second;

  if (types != (TypeFactory *)0)
    delete types;
  if (translate != (Translate *)0)
    delete translate;
  if (loader != (LoadImage *)0)
    delete loader;
  if (pcodeinjectlib != (PcodeInjectLibrary *)0)
    delete pcodeinjectlib;
  if (commentdb != (CommentDatabase *)0)
    delete commentdb;
  if (cpool != (ConstantPool *)0)
    delete cpool;
  if (context != (ContextDatabase *)0)
    delete context;
}